

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O2

int Precond(sunrealtype t,N_Vector c,N_Vector fc,int jok,int *jcurPtr,sunrealtype gamma,
           void *user_data)

{
  long lVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  sunrealtype *rate;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  undefined4 in_register_00000014;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  ulong in_XMM1_Qb;
  int flag;
  double local_58;
  ulong uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  uVar9 = *(undefined8 *)((long)user_data + 0x988);
  lVar12 = N_VGetArrayPointer(c,fc,CONCAT44(in_register_00000014,jok));
  uVar10 = *(undefined8 *)((long)user_data + 0x980);
  flag = ARKodeGetErrWeights(uVar9);
  iVar11 = check_flag(&flag,"ARKodeGetErrWeights",1);
  if (iVar11 == 0) {
    lVar13 = N_VGetArrayPointer(uVar10);
    uVar3 = *(uint *)((long)user_data + 0x48);
    uVar4 = *(uint *)((long)user_data + 0x58);
    lVar14 = (long)(int)uVar3;
    dVar2 = *(double *)((long)user_data + 0x2b0);
    uVar5 = *(uint *)((long)user_data + 0x5c);
    uVar6 = *(uint *)((long)user_data + 0x60);
    iVar11 = *(int *)((long)user_data + 100);
    rate = (sunrealtype *)N_VGetArrayPointer(*(undefined8 *)((long)user_data + 0x978));
    dVar23 = (double)N_VWrmsNorm(fc,uVar10);
    uStack_50 = in_XMM1_Qb & 0x7fffffffffffffff;
    dVar23 = ABS(gamma) * 1000.0 * 2.220446049250313e-16 * 216.0 * dVar23;
    uVar22 = -(ulong)(dVar23 == 0.0);
    local_58 = (double)(uVar22 & 0x3ff0000000000000 | ~uVar22 & (ulong)dVar23);
    uVar22 = 0;
    uVar16 = 0;
    if (0 < (int)uVar3) {
      uVar16 = (ulong)uVar3;
    }
    uVar17 = 0;
    if (0 < (int)uVar5) {
      uVar17 = (ulong)uVar5;
    }
    uVar20 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar20 = uVar22;
    }
    for (; uVar22 != uVar20; uVar22 = uVar22 + 1) {
      iVar7 = *(int *)((long)user_data + uVar22 * 4 + 0xb8);
      for (uVar21 = 0; uVar21 != uVar17; uVar21 = uVar21 + 1) {
        iVar8 = *(int *)((long)user_data + uVar21 * 4 + 0xb0);
        lVar18 = (long)(int)(iVar8 * uVar3 + iVar7 * iVar11);
        for (uVar19 = 0; uVar19 != uVar16; uVar19 = uVar19 + 1) {
          lVar1 = uVar19 + lVar18;
          local_48 = *(double *)(lVar12 + lVar1 * 8);
          dVar23 = ABS(local_48) * dVar2;
          dVar24 = local_58 / *(double *)(lVar13 + lVar1 * 8);
          if (dVar23 <= dVar24) {
            dVar23 = dVar24;
          }
          uStack_40 = 0;
          *(double *)(lVar12 + lVar1 * 8) = local_48 + dVar23;
          WebRates(*(double *)((long)user_data + 0x2a0) * (double)iVar8,
                   *(double *)((long)user_data + 0x2a8) * (double)iVar7,-gamma / dVar23,
                   (sunrealtype *)
                   (lVar12 + (long)(*(int *)((long)user_data + 0x50) * iVar7 + iVar8) *
                             (long)*(int *)((long)user_data + 0x40) * 8),rate,(WebData)user_data);
          for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
            *(double *)
             (*(long *)(*(long *)((long)user_data + uVar21 * 8 + uVar22 * (long)(int)uVar5 * 8) +
                       uVar19 * 8) + uVar15 * 8) =
                 (rate[uVar15] - *(double *)((long)user_data + uVar15 * 8 + lVar18 * 8 + 0x2b8)) *
                 (-gamma / dVar23);
          }
          *(double *)(lVar12 + lVar1 * 8) = local_48;
        }
      }
    }
    uVar16 = 0;
    uVar22 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar22 = uVar16;
    }
    do {
      if (uVar22 == uVar16) {
        *jcurPtr = 1;
        return 0;
      }
      SUNDlsMat_denseAddIdentity(*(undefined8 *)((long)user_data + uVar16 * 8),lVar14);
      lVar12 = SUNDlsMat_denseGETRF
                         (*(undefined8 *)((long)user_data + uVar16 * 8),lVar14,lVar14,
                          *(undefined8 *)((long)user_data + uVar16 * 8 + 0x20));
      uVar16 = uVar16 + 1;
    } while (lVar12 == 0);
  }
  return 1;
}

Assistant:

static int Precond(sunrealtype t, N_Vector c, N_Vector fc, sunbooleantype jok,
                   sunbooleantype* jcurPtr, sunrealtype gamma, void* user_data)
{
  sunrealtype*** P;
  sunindextype ier;
  sunindextype** pivot;
  int i, if0, if00, ig, igx, igy, j, jj, jx, jy;
  int *jxr, *jyr, ngrp, ngx, ngy, mxmp, mp, flag;
  sunrealtype uround, fac, r, r0, save, srur;
  sunrealtype *f1, *fsave, *cdata, *rewtdata;
  WebData wdata;
  void* arkode_mem;
  N_Vector rewt;

  wdata      = (WebData)user_data;
  arkode_mem = wdata->arkode_mem;
  cdata      = N_VGetArrayPointer(c);
  rewt       = wdata->rewt;
  flag       = ARKodeGetErrWeights(arkode_mem, rewt);
  if (check_flag(&flag, "ARKodeGetErrWeights", 1)) { return (1); }
  rewtdata = N_VGetArrayPointer(rewt);

  uround = SUN_UNIT_ROUNDOFF;

  P     = wdata->P;
  pivot = wdata->pivot;
  jxr   = wdata->jxr;
  jyr   = wdata->jyr;
  mp    = wdata->mp;
  srur  = wdata->srur;
  ngrp  = wdata->ngrp;
  ngx   = wdata->ngx;
  ngy   = wdata->ngy;
  mxmp  = wdata->mxmp;
  fsave = wdata->fsave;

  /* Make mp calls to fblock to approximate each diagonal block of Jacobian.
     Here, fsave contains the base value of the rate vector and
     r0 is a minimum increment factor for the difference quotient. */

  f1 = N_VGetArrayPointer(wdata->tmp);

  fac = N_VWrmsNorm(fc, rewt);
  r0  = SUN_RCONST(1000.0) * fabs(gamma) * uround * NEQ * fac;
  if (r0 == ZERO) { r0 = ONE; }

  for (igy = 0; igy < ngy; igy++)
  {
    jy   = jyr[igy];
    if00 = jy * mxmp;
    for (igx = 0; igx < ngx; igx++)
    {
      jx  = jxr[igx];
      if0 = if00 + jx * mp;
      ig  = igx + igy * ngx;
      /* Generate ig-th diagonal block */
      for (j = 0; j < mp; j++)
      {
        /* Generate the jth column as a difference quotient */
        jj   = if0 + j;
        save = cdata[jj];
        r    = MAX(srur * fabs(save), r0 / rewtdata[jj]);
        cdata[jj] += r;
        fac = -gamma / r;
        fblock(t, cdata, jx, jy, f1, wdata);
        for (i = 0; i < mp; i++)
        {
          P[ig][j][i] = (f1[i] - fsave[if0 + i]) * fac;
        }
        cdata[jj] = save;
      }
    }
  }

  /* Add identity matrix and do LU decompositions on blocks. */

  for (ig = 0; ig < ngrp; ig++)
  {
    SUNDlsMat_denseAddIdentity(P[ig], mp);
    ier = SUNDlsMat_denseGETRF(P[ig], mp, mp, pivot[ig]);
    if (ier != 0) { return (1); }
  }

  *jcurPtr = SUNTRUE;
  return (0);
}